

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argvParser.cpp
# Opt level: O0

argvParser * __thiscall argvParser::getHelpMessage_abi_cxx11_(argvParser *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppsVar3;
  reference ppaVar4;
  ulong uVar5;
  argvParser *in_RSI;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  undefined1 local_190 [128];
  undefined1 local_110 [40];
  argument *arg;
  string local_e0 [4];
  int argIndex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  value_type local_a0;
  section *sec;
  string local_90 [4];
  int secIndex;
  string requiredArgs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [39];
  byte local_19;
  argvParser *this_local;
  string *s;
  
  local_19 = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  std::operator+(local_40,(char *)&(in_RSI->super_argParserAdvancedConfiguration).applicationName);
  std::__cxx11::string::operator+=((string *)this,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::operator+(local_70,(char *)&in_RSI->description);
  std::__cxx11::string::operator+=((string *)this,(string *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string(local_90);
  for (sec._4_4_ = 0; uVar5 = (ulong)sec._4_4_,
      sVar2 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::size((in_RSI->super_argParserAdvancedConfiguration).newargconfig), uVar5 < sVar2;
      sec._4_4_ = sec._4_4_ + 1) {
    ppsVar3 = std::
              vector<argParserAdvancedConfiguration::section_*,_std::allocator<argParserAdvancedConfiguration::section_*>_>
              ::at((in_RSI->super_argParserAdvancedConfiguration).newargconfig,(long)sec._4_4_);
    local_a0 = *ppsVar3;
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::operator+((char *)local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x116304);
      std::operator+(local_c0,(char *)local_e0);
      std::__cxx11::string::operator+=((string *)this,(string *)local_c0);
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string(local_e0);
    }
    for (arg._4_4_ = 0; uVar5 = (ulong)arg._4_4_,
        sVar2 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::size(local_a0->arguments), uVar5 < sVar2; arg._4_4_ = arg._4_4_ + 1) {
      ppaVar4 = std::
                vector<argParserAdvancedConfiguration::argument_*,_std::allocator<argParserAdvancedConfiguration::argument_*>_>
                ::at(local_a0->arguments,(long)arg._4_4_);
      local_110._32_8_ = *ppaVar4;
      std::__cxx11::string::string((string *)(local_190 + 0x60),(string *)local_110._32_8_);
      std::__cxx11::string::string((string *)(local_190 + 0x40),(string *)(local_110._32_8_ + 0x20))
      ;
      std::__cxx11::string::string((string *)(local_190 + 0x20),(string *)(local_110._32_8_ + 0x40))
      ;
      argParserAdvancedConfiguration::buildHelpLine
                ((argParserAdvancedConfiguration *)local_110,(string *)in_RSI,
                 (string *)(local_190 + 0x60),(string *)(local_190 + 0x40));
      std::__cxx11::string::operator+=((string *)this,(string *)local_110);
      std::__cxx11::string::~string((string *)local_110);
      std::__cxx11::string::~string((string *)(local_190 + 0x20));
      std::__cxx11::string::~string((string *)(local_190 + 0x40));
      std::__cxx11::string::~string((string *)(local_190 + 0x60));
      if ((*(bool *)(local_110._32_8_ + 0xe8) & 1U) != 0) {
        std::__cxx11::string::string(local_1b0,(string *)local_110._32_8_);
        std::__cxx11::string::string(local_1d0,(string *)(local_110._32_8_ + 0x20));
        std::__cxx11::string::string(local_1f0,(string *)(local_110._32_8_ + 0x40));
        argParserAdvancedConfiguration::buildHelpLine
                  ((argParserAdvancedConfiguration *)local_190,(string *)in_RSI,(string *)local_1b0,
                   (string *)local_1d0);
        std::__cxx11::string::operator+=(local_90,(string *)local_190);
        std::__cxx11::string::~string((string *)local_190);
        std::__cxx11::string::~string(local_1f0);
        std::__cxx11::string::~string(local_1d0);
        std::__cxx11::string::~string(local_1b0);
      }
    }
  }
  bVar1 = foundAllRequierdArgs(in_RSI);
  if (!bVar1) {
    std::operator+((char *)local_230,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "\nrequired arguments are : \n");
    std::operator+(local_210,(char *)local_230);
    std::__cxx11::string::operator+=((string *)this,(string *)local_210);
    std::__cxx11::string::~string((string *)local_210);
    std::__cxx11::string::~string(local_230);
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::operator+((char *)local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "failed argument : ");
    std::__cxx11::string::operator+=((string *)this,local_250);
    std::__cxx11::string::~string(local_250);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      std::operator+((char *)local_270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"\n  ");
      std::__cxx11::string::operator+=((string *)this,local_270);
      std::__cxx11::string::~string(local_270);
    }
  }
  local_19 = 1;
  std::__cxx11::string::~string(local_90);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string argvParser::getHelpMessage() {
    string s;
    s += applicationName + "\n";
    s += description + "\nUsage:\n";
    string requiredArgs;
    for(int secIndex = 0; secIndex < newargconfig->size();secIndex++ ){
        section *sec = newargconfig->at(secIndex);
        if(!sec->sectionName.empty()){
            s+= " " + sec->sectionName + ": \n";
        }
        for(int argIndex = 0; argIndex<sec->arguments->size();argIndex++){
            argument * arg = sec->arguments->at(argIndex);
            s += buildHelpLine(arg->argShort,arg->argLong,arg->helpMessage);
            if(arg->requiredAndNotHitJet)
                requiredArgs += buildHelpLine(arg->argShort, arg->argLong, arg->helpMessage);
        }
    }
    if (!foundAllRequierdArgs()) {
        s += "\nrequired arguments are : \n" + requiredArgs + "\n";
    }

    if (!lastFailedArg.empty()) {
        s += "failed argument : " + lastFailedArg;
        if (!errorMessage.empty()) {
            s += "\n  " + errorMessage;
        }
    }

    return s;
}